

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *this;
  undefined1 local_2a8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> line;
  command_type local_278;
  allocator<char> local_251;
  string local_250;
  anon_class_1_0_00000001 local_229;
  command_type local_228;
  allocator<char> local_201;
  string local_200;
  anon_class_1_0_00000001 local_1d9;
  command_type local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  anon_class_1_0_00000001 local_189;
  hints_type local_188;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  Cmd cmd;
  char **argv_local;
  int argc_local;
  
  cmd.history_file_.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"history.txt",&local_151);
  Cmd::Cmd((Cmd *)local_130,&local_150,_stdin,_stdout);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  cmd.prompt.field_2._M_local_buf[8] = '\x01';
  std::function<std::optional<Cmd::Hint>(std::basic_string_view<char,std::char_traits<char>>)>::
  function<main::__0,void>
            ((function<std::optional<Cmd::Hint>(std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_188,&local_189);
  Cmd::setHintsCallback((Cmd *)local_130,&local_188);
  std::function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  ~function(&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"test",&local_1b1);
  std::
  function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::function<main::__1,void>
            ((function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)&local_1d8,&local_1d9);
  Cmd::registerCommand((Cmd *)local_130,&local_1b0,&local_1d8);
  std::
  function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"clear",&local_201);
  std::
  function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::function<main::__2,void>
            ((function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)&local_228,&local_229);
  Cmd::registerCommand((Cmd *)local_130,&local_200,&local_228);
  std::
  function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"exit",&local_251);
  std::
  function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::function<main::__3,void>
            ((function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)&local_278,
             (anon_class_1_0_00000001 *)
             &line.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0x27);
  Cmd::registerCommand((Cmd *)local_130,&local_250,&local_278);
  std::
  function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_278);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::operator=((string *)local_130,"(Password) ");
  Cmd::nextLine_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2a8,(Cmd *)local_130,true);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_2a8);
  if (bVar1) {
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2a8);
    this = std::operator<<((ostream *)&std::cout,(string *)pbVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2a8);
  std::__cxx11::string::operator=((string *)local_130,"(Cmd) ");
  Cmd::cmdLoop((Cmd *)local_130);
  Cmd::~Cmd((Cmd *)local_130);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

	(void)argc;
	(void)argv;

	Cmd cmd("history.txt");
	cmd.multiline_mode = true;

	cmd.setHintsCallback([](std::string_view buf) -> std::optional<Cmd::Hint> {
		if (buf == "git remote add") {
			Cmd::Hint r;
			r.hint_string = " <name> <url>";
			r.color = 90;
			r.bold = false;
			return r;
		}
		return {};
	});

	cmd.registerCommand("test", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)cmd;
		printf("Hello World!\n");
		for(size_t i = 1; i < argv.size(); ++i) {
			printf("\t%s\n", argv[i].c_str());
		}
		return false;
	});

	cmd.registerCommand("clear", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)argv;
		cmd->clearScreen();
		return false;
	});

	cmd.registerCommand("exit", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)cmd;
		(void)argv;
		return true;
	});

	cmd.prompt = "(Password) ";

	if (auto line = cmd.nextLine(true)) {
		std::cout << *line << std::endl;
	}

	cmd.prompt = "(Cmd) ";

	cmd.cmdLoop();
}